

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegAudioStreamReader.cpp
# Opt level: O1

int __thiscall
MpegAudioStreamReader::getTSDescriptor
          (MpegAudioStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  uint8_t *buff;
  
  buff = MP3Codec::mp3FindFrame
                   ((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_buffer,
                    (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd);
  if (buff != (uint8_t *)0x0) {
    MP3Codec::mp3DecodeFrame
              (&this->super_MP3Codec,buff,
               (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd);
  }
  return 0;
}

Assistant:

int MpegAudioStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, bool hdmvDescriptors)
{
    uint8_t* frame = findFrame(m_buffer, m_bufEnd);
    if (frame == nullptr)
        return 0;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
    return 0;
}